

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_load_standard_ports(sexp ctx,sexp env,FILE *in,FILE *out,FILE *err,int no_close)

{
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  undefined4 in_R9D;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp p;
  sexp name;
  sexp name_00;
  sexp psVar1;
  undefined4 in_stack_ffffffffffffffd0;
  
  psVar1 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffb8,0,0x10);
  name = (sexp)&stack0xffffffffffffffc8;
  name_00 = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffb8;
  if (in_RDX != 0) {
    psVar1 = sexp_make_input_port(psVar1,(FILE *)name_00,name);
    (psVar1->value).flonum_bits[0x2c] = (char)in_R9D;
    sexp_set_parameter((sexp)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),psVar1,name_00,name);
  }
  if (in_RCX != 0) {
    psVar1 = sexp_make_output_port(psVar1,(FILE *)name_00,name);
    (psVar1->value).flonum_bits[0x2c] = (char)in_R9D;
    sexp_set_parameter((sexp)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),psVar1,name_00,name);
  }
  if (in_R8 != 0) {
    psVar1 = sexp_make_output_port(psVar1,(FILE *)name_00,name);
    (psVar1->value).flonum_bits[0x2c] = (char)in_R9D;
    sexp_set_parameter((sexp)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),psVar1,name_00,name);
  }
  *(sexp *)(in_RDI + 0x6080) = name_00;
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_load_standard_ports (sexp ctx, sexp env, FILE* in, FILE* out,
                               FILE* err, int no_close) {
  sexp_gc_var1(p);
  sexp_gc_preserve1(ctx, p);
  if (!env) env = sexp_context_env(ctx);
  if (in) {
    p = sexp_make_input_port(ctx, in, SEXP_FALSE);
    sexp_port_no_closep(p) = no_close;
    sexp_set_parameter(ctx, env, sexp_global(ctx, SEXP_G_CUR_IN_SYMBOL), p);
  }
  if (out) {
    p = sexp_make_output_port(ctx, out, SEXP_FALSE);
    sexp_port_no_closep(p) = no_close;
    sexp_set_parameter(ctx, env, sexp_global(ctx, SEXP_G_CUR_OUT_SYMBOL), p);
  }
  if (err) {
    p = sexp_make_output_port(ctx, err, SEXP_FALSE);
    sexp_port_no_closep(p) = no_close;
    sexp_set_parameter(ctx, env, sexp_global(ctx, SEXP_G_CUR_ERR_SYMBOL), p);
  }
  sexp_gc_release1(ctx);
  return SEXP_VOID;
}